

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QVariant * __thiscall
QMap<QByteArray,_QVariant>::operator[](QMap<QByteArray,_QVariant> *this,QByteArray *key)

{
  QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QByteArray,_QVariant>_>,_bool> pVar3;
  QMap<QByteArray,_QVariant> copy;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  local_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  pair<const_QByteArray,_QVariant> local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_80.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_*>
          )(QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
            *)0x0;
  }
  else {
    local_80.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_80.d.ptr !=
        (QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
         *)local_80.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>
                          *)local_80.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QVariant>,_std::_Select1st<std::pair<const_QByteArray,_QVariant>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_58.first.d.d = (key->d).d;
    local_58.first.d.ptr = (key->d).ptr;
    local_58.first.d.size = (key->d).size;
    if (&(local_58.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.first.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.first.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.second.d.data._16_8_ = 0;
    local_58.second.d._24_8_ = 2;
    local_58.second.d.data.shared = (PrivateShared *)0x0;
    local_58.second.d.data._8_8_ = 0;
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    local_60 = 2;
    pVar3 = std::
            _Rb_tree<QByteArray,std::pair<QByteArray_const,QVariant>,std::_Select1st<std::pair<QByteArray_const,QVariant>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QVariant>>>
            ::_M_insert_unique<std::pair<QByteArray_const,QVariant>>
                      ((_Rb_tree<QByteArray,std::pair<QByteArray_const,QVariant>,std::_Select1st<std::pair<QByteArray_const,QVariant>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QVariant>>>
                        *)&pQVar1->m,&local_58);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    QVariant::~QVariant(&local_58.second);
    if (&(local_58.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_58.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.first.d.d)->super_QArrayData,1,0x10);
      }
    }
    QVariant::~QVariant((QVariant *)&local_78);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QVariant *)&iVar2._M_node[1]._M_right;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }